

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove.c
# Opt level: O3

void * linkedlist_remove(s_linkedlist *linked_list,uint index)

{
  s_linkedlist_node *psVar1;
  s_linkedlist_node *psVar2;
  void *pvVar3;
  s_linkedlist_node *psVar4;
  int iVar5;
  s_linkedlist_node *__ptr;
  
  __ptr = linked_list->head;
  if (__ptr != (s_linkedlist_node *)0x0) {
    iVar5 = index + 1;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        psVar1 = __ptr->previous;
        psVar4 = psVar1;
        if (psVar1 == (s_linkedlist_node *)0x0) {
          psVar4 = (s_linkedlist_node *)linked_list;
        }
        psVar2 = __ptr->next;
        psVar4->next = psVar2;
        psVar4 = (s_linkedlist_node *)&linked_list->tail;
        if (psVar2 != (s_linkedlist_node *)0x0) {
          psVar4 = psVar2;
        }
        psVar4->previous = psVar1;
        pvVar3 = __ptr->element;
        free(__ptr);
        linked_list->size = linked_list->size - 1;
        return pvVar3;
      }
      __ptr = __ptr->next;
    } while (__ptr != (s_linkedlist_node *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *linkedlist_remove(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            void *element_to_return = node->element;

            free(node);
            linked_list->size -= 1;

            return (element_to_return);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}